

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O1

size_t ptls_asn1_read_type(uint8_t *bytes,size_t bytes_max,int *structure_bit,int *type_class,
                          uint32_t *type_number,int *decode_error,int level,
                          ptls_minicrypto_log_ctx_t *log_ctx)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  size_t byte_index;
  bool bVar4;
  bool bVar5;
  
  bVar2 = *bytes;
  *structure_bit = bVar2 >> 5 & 1;
  *type_class = (uint)(bVar2 >> 6);
  *type_number = bVar2 & 0x1f;
  byte_index = 1;
  if ((bVar2 & 0x1f) == 0x1f) {
    uVar3 = 0;
    do {
      bVar4 = bytes_max <= byte_index;
      bVar5 = (int)uVar3 < 0;
      if (bVar5 || bVar4) break;
      pbVar1 = bytes + byte_index;
      byte_index = byte_index + 1;
      uVar3 = uVar3 << 7 | *pbVar1 & 0x7f;
    } while ((char)*pbVar1 < '\0');
    if (bVar5 || bVar4) {
      ptls_asn1_error_message("Incorrect type coding",bytes_max,byte_index,level,log_ctx);
      *decode_error = 0x235;
    }
    else {
      *type_number = uVar3;
    }
  }
  return byte_index;
}

Assistant:

size_t ptls_asn1_read_type(const uint8_t *bytes, size_t bytes_max, int *structure_bit, int *type_class, uint32_t *type_number,
                           int *decode_error, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    /* Get the type byte */
    size_t byte_index = 1;
    uint8_t first_byte = bytes[0];
    *structure_bit = (first_byte >> 5) & 1;
    *type_class = (first_byte >> 6) & 3;
    *type_number = first_byte & 31;

    if (*type_number == 31) {
        uint32_t long_type = 0;
        const uint32_t type_number_limit = 0x07FFFFFFF;
        int next_byte;
        int end_found = 0;

        while (byte_index < bytes_max && long_type <= type_number_limit) {
            next_byte = bytes[byte_index++];
            long_type <<= 7;
            long_type |= next_byte & 127;
            if ((next_byte & 128) == 0) {
                end_found = 1;
                break;
            }
        }

        if (end_found) {
            *type_number = long_type;
        } else {
            /* This is an error */
            byte_index = ptls_asn1_error_message("Incorrect type coding", bytes_max, byte_index, level, log_ctx);
            *decode_error = PTLS_ERROR_BER_MALFORMED_TYPE;
        }
    }

    return byte_index;
}